

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCommand::HandleUploadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmMakefile *this_00;
  int iVar3;
  CURLcode CVar4;
  long lVar5;
  FILE *__stream;
  unsigned_long uVar6;
  CURL *curl;
  ostream *poVar7;
  char *pcVar8;
  ulong uVar9;
  bool bVar10;
  pointer pbVar11;
  long lVar12;
  string filename;
  string url;
  string errStr;
  cURLEasyGuard g_curl;
  cmFileCommandVectorOfChar chunkDebug;
  cmFileCommandVectorOfChar chunkResponse;
  cURLProgressHelper helper;
  string logVar;
  string statusVar;
  string local_2c8;
  long *local_2a8 [2];
  long local_298 [2];
  string local_288 [3];
  ios_base local_218 [264];
  cURLEasyGuard local_110;
  vector<char,_std::allocator<char>_> local_108;
  vector<char,_std::allocator<char>_> local_e8;
  long local_d0;
  string *local_c8 [2];
  string local_b8;
  string local_98;
  string local_78;
  ulong local_58;
  value_type local_50;
  undefined7 uStack_4f;
  long local_40 [2];
  
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11) < 0x41) {
    local_288[0]._M_dataplus._M_p = (pointer)&local_288[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_288,"UPLOAD must be called with at least three arguments.","");
    cmCommand::SetError(&this->super_cmCommand,local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288[0]._M_dataplus._M_p != &local_288[0].field_2) {
      operator_delete(local_288[0]._M_dataplus._M_p,
                      CONCAT71(local_288[0].field_2._M_allocated_capacity._1_7_,
                               local_288[0].field_2._M_local_buf[0]) + 1);
    }
    return false;
  }
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  pcVar2 = pbVar11[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,pcVar2,pcVar2 + pbVar11[1]._M_string_length);
  local_2a8[0] = local_298;
  pcVar2 = pbVar11[2]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2a8,pcVar2,pcVar2 + pbVar11[2]._M_string_length);
  pbVar11 = pbVar11 + 3;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  lVar5 = 0;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  lVar12 = 0;
  uVar9 = 0;
  if (pbVar11 !=
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    uVar9 = 0;
    lVar12 = 0;
    lVar5 = 0;
    do {
      iVar3 = std::__cxx11::string::compare((char *)pbVar11);
      if (iVar3 == 0) {
        pbVar11 = pbVar11 + 1;
        if (pbVar11 ==
            (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          local_288[0]._M_dataplus._M_p = (pointer)&local_288[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_288,"UPLOAD missing time for TIMEOUT.","");
          cmCommand::SetError(&this->super_cmCommand,local_288);
          goto LAB_003bb073;
        }
        lVar5 = atol((pbVar11->_M_dataplus)._M_p);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)pbVar11);
        if (iVar3 == 0) {
          pbVar11 = pbVar11 + 1;
          if (pbVar11 ==
              (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            local_288[0]._M_dataplus._M_p = (pointer)&local_288[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_288,"UPLOAD missing time for INACTIVITY_TIMEOUT.","");
            cmCommand::SetError(&this->super_cmCommand,local_288);
            goto LAB_003bb073;
          }
          lVar12 = atol((pbVar11->_M_dataplus)._M_p);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)pbVar11);
          if (iVar3 == 0) {
            pbVar11 = pbVar11 + 1;
            if (pbVar11 ==
                (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              local_288[0]._M_dataplus._M_p = (pointer)&local_288[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_288,"UPLOAD missing VAR for LOG.","");
              cmCommand::SetError(&this->super_cmCommand,local_288);
              goto LAB_003bb073;
            }
            std::__cxx11::string::_M_assign((string *)&local_98);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)pbVar11);
            if (iVar3 == 0) {
              pbVar11 = pbVar11 + 1;
              if (pbVar11 ==
                  (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
                local_288[0]._M_dataplus._M_p = (pointer)&local_288[0].field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_288,"UPLOAD missing VAR for STATUS.","");
                cmCommand::SetError(&this->super_cmCommand,local_288);
                goto LAB_003bb073;
              }
              std::__cxx11::string::_M_assign((string *)&local_78);
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)pbVar11);
              if (iVar3 == 0) {
                uVar9 = 1;
              }
            }
          }
        }
      }
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 !=
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  __stream = (FILE *)cmsys::SystemTools::Fopen(&local_2c8,"rb");
  if (__stream == (FILE *)0x0) {
    local_288[0]._M_dataplus._M_p = (pointer)&local_288[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_288,"UPLOAD cannot open file \'","");
    local_c8[0] = &((cURLProgressHelper *)local_c8)->Text;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,local_2c8._M_dataplus._M_p,
               local_2c8._M_dataplus._M_p + local_2c8._M_string_length);
    std::__cxx11::string::append((char *)local_c8);
    std::__cxx11::string::_M_append((char *)local_288,(ulong)local_c8[0]);
    if (local_c8[0] != &((cURLProgressHelper *)local_c8)->Text) {
      operator_delete(local_c8[0],(ulong)(local_b8._M_dataplus._M_p + 1));
    }
    cmCommand::SetError(&this->super_cmCommand,local_288);
LAB_003bb073:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288[0]._M_dataplus._M_p != &local_288[0].field_2) {
      operator_delete(local_288[0]._M_dataplus._M_p,
                      CONCAT71(local_288[0].field_2._M_allocated_capacity._1_7_,
                               local_288[0].field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    uVar6 = cmsys::SystemTools::FileLength(&local_2c8);
    curl_global_init(3);
    curl = curl_easy_init();
    if (curl != (CURL *)0x0) {
      local_110.Easy = curl;
      local_d0 = lVar12;
      local_58 = uVar9;
      CVar4 = curl_easy_setopt(curl,CURLOPT_FAILONERROR,1);
      if (CVar4 == CURLE_OK) {
        CVar4 = curl_easy_setopt(curl,CURLOPT_UPLOAD,1);
        if (CVar4 != CURLE_OK) {
          local_288[0]._M_dataplus._M_p = (pointer)&local_288[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_288,"UPLOAD cannot set upload flag: ","");
          curl_easy_strerror(CVar4);
          std::__cxx11::string::append((char *)local_288);
          cmCommand::SetError(&this->super_cmCommand,local_288);
          goto LAB_003bb161;
        }
        CVar4 = curl_easy_setopt(curl,CURLOPT_URL,local_2a8[0]);
        if (CVar4 != CURLE_OK) {
          local_288[0]._M_dataplus._M_p = (pointer)&local_288[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_288,"UPLOAD cannot set url: ","");
          curl_easy_strerror(CVar4);
          std::__cxx11::string::append((char *)local_288);
          cmCommand::SetError(&this->super_cmCommand,local_288);
          goto LAB_003bb161;
        }
        CVar4 = curl_easy_setopt(curl,CURLOPT_WRITEFUNCTION,
                                 anon_unknown.dwarf_a08ab9::cmWriteToMemoryCallback);
        if (CVar4 != CURLE_OK) {
          local_288[0]._M_dataplus._M_p = (pointer)&local_288[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_288,"UPLOAD cannot set write function: ","");
          curl_easy_strerror(CVar4);
          std::__cxx11::string::append((char *)local_288);
          cmCommand::SetError(&this->super_cmCommand,local_288);
          goto LAB_003bb161;
        }
        CVar4 = curl_easy_setopt(curl,CURLOPT_DEBUGFUNCTION,
                                 anon_unknown.dwarf_a08ab9::cmFileCommandCurlDebugCallback);
        if (CVar4 != CURLE_OK) {
          local_288[0]._M_dataplus._M_p = (pointer)&local_288[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_288,"UPLOAD cannot set debug function: ","");
          curl_easy_strerror(CVar4);
          std::__cxx11::string::append((char *)local_288);
          cmCommand::SetError(&this->super_cmCommand,local_288);
          goto LAB_003bb161;
        }
        local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        CVar4 = curl_easy_setopt(curl,CURLOPT_WRITEDATA);
        if (CVar4 == CURLE_OK) {
          CVar4 = curl_easy_setopt(curl,CURLOPT_DEBUGDATA,&local_108);
          if (CVar4 != CURLE_OK) {
            local_288[0]._M_dataplus._M_p = (pointer)&local_288[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_288,"UPLOAD cannot set debug data: ","");
            curl_easy_strerror(CVar4);
            std::__cxx11::string::append((char *)local_288);
            cmCommand::SetError(&this->super_cmCommand,local_288);
            goto LAB_003bb364;
          }
          CVar4 = curl_easy_setopt(curl,CURLOPT_FOLLOWLOCATION,1);
          if (CVar4 != CURLE_OK) {
            local_288[0]._M_dataplus._M_p = (pointer)&local_288[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_288,"UPLOAD cannot set follow-redirect option: ","");
            curl_easy_strerror(CVar4);
            std::__cxx11::string::append((char *)local_288);
            cmCommand::SetError(&this->super_cmCommand,local_288);
            goto LAB_003bb364;
          }
          if ((local_98._M_string_length != 0) &&
             (CVar4 = curl_easy_setopt(curl,CURLOPT_VERBOSE,1), CVar4 != CURLE_OK)) {
            local_288[0]._M_dataplus._M_p = (pointer)&local_288[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_288,"UPLOAD cannot set verbose: ","");
            curl_easy_strerror(CVar4);
            std::__cxx11::string::append((char *)local_288);
            cmCommand::SetError(&this->super_cmCommand,local_288);
            goto LAB_003bb364;
          }
          if ((0 < lVar5) &&
             (CVar4 = curl_easy_setopt(curl,CURLOPT_TIMEOUT,lVar5), CVar4 != CURLE_OK)) {
            local_288[0]._M_dataplus._M_p = (pointer)&local_288[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_288,"UPLOAD cannot set timeout: ","");
            curl_easy_strerror(CVar4);
            std::__cxx11::string::append((char *)local_288);
            cmCommand::SetError(&this->super_cmCommand,local_288);
            goto LAB_003bb364;
          }
          if (0 < local_d0) {
            curl_easy_setopt(curl,CURLOPT_LOW_SPEED_LIMIT,1);
            curl_easy_setopt(curl,CURLOPT_LOW_SPEED_TIME,local_d0);
          }
          anon_unknown.dwarf_a08ab9::cURLProgressHelper::cURLProgressHelper
                    ((cURLProgressHelper *)local_c8,this,"upload");
          if ((local_58 & 1) == 0) {
LAB_003bb626:
            CVar4 = curl_easy_setopt(curl,CURLOPT_READDATA,__stream);
            if (CVar4 != CURLE_OK) {
              local_288[0]._M_dataplus._M_p = (pointer)&local_288[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_288,"UPLOAD cannot set input file: ","");
              curl_easy_strerror(CVar4);
              std::__cxx11::string::append((char *)local_288);
              cmCommand::SetError(&this->super_cmCommand,local_288);
              goto LAB_003bb6e4;
            }
            CVar4 = curl_easy_setopt(curl,CURLOPT_INFILESIZE,uVar6);
            if (CVar4 != CURLE_OK) {
              local_288[0]._M_dataplus._M_p = (pointer)&local_288[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_288,"UPLOAD cannot set input file size: ","");
              curl_easy_strerror(CVar4);
              std::__cxx11::string::append((char *)local_288);
              cmCommand::SetError(&this->super_cmCommand,local_288);
              goto LAB_003bb6e4;
            }
            CVar4 = curl_easy_perform(curl);
            local_110.Easy = (CURL *)0x0;
            curl_easy_cleanup(curl);
            if (local_78._M_string_length != 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
              poVar7 = (ostream *)std::ostream::operator<<(local_288,CVar4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,";\"",2);
              pcVar8 = curl_easy_strerror(CVar4);
              poVar7 = std::operator<<(poVar7,pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
              this_00 = (this->super_cmCommand).Makefile;
              std::__cxx11::stringbuf::str();
              cmMakefile::AddDefinition(this_00,&local_78,(char *)CONCAT71(uStack_4f,local_50));
              if ((long *)CONCAT71(uStack_4f,local_50) != local_40) {
                operator_delete((long *)CONCAT71(uStack_4f,local_50),local_40[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_288);
              std::ios_base::~ios_base(local_218);
            }
            curl_global_cleanup();
            fclose(__stream);
            bVar10 = true;
            if (local_98._M_string_length != 0) {
              paVar1 = &local_288[0].field_2;
              local_288[0]._M_string_length = 0;
              local_288[0].field_2._M_local_buf[0] = '\0';
              local_288[0]._M_dataplus._M_p = (pointer)paVar1;
              if (local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                local_50 = '\0';
                std::vector<char,_std::allocator<char>_>::push_back(&local_e8,&local_50);
                std::__cxx11::string::append((char *)local_288);
                std::__cxx11::string::append((char *)local_288);
                std::__cxx11::string::append((char *)local_288);
              }
              if (local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                local_50 = '\0';
                std::vector<char,_std::allocator<char>_>::push_back(&local_108,&local_50);
                std::__cxx11::string::append((char *)local_288);
                std::__cxx11::string::append((char *)local_288);
                std::__cxx11::string::append((char *)local_288);
              }
              cmMakefile::AddDefinition
                        ((this->super_cmCommand).Makefile,&local_98,local_288[0]._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_288[0]._M_dataplus._M_p != paVar1) {
                operator_delete(local_288[0]._M_dataplus._M_p,
                                CONCAT71(local_288[0].field_2._M_allocated_capacity._1_7_,
                                         local_288[0].field_2._M_local_buf[0]) + 1);
              }
            }
          }
          else {
            CVar4 = curl_easy_setopt(curl,CURLOPT_NOPROGRESS,0);
            if (CVar4 == CURLE_OK) {
              CVar4 = curl_easy_setopt(curl,CURLOPT_PROGRESSFUNCTION,
                                       anon_unknown.dwarf_a08ab9::cmFileUploadProgressCallback);
              if (CVar4 == CURLE_OK) {
                CVar4 = curl_easy_setopt(curl,CURLOPT_PROGRESSDATA,(cURLProgressHelper *)local_c8);
                if (CVar4 == CURLE_OK) goto LAB_003bb626;
                local_288[0]._M_dataplus._M_p = (pointer)&local_288[0].field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_288,"UPLOAD cannot set progress data: ","");
                curl_easy_strerror(CVar4);
                std::__cxx11::string::append((char *)local_288);
                cmCommand::SetError(&this->super_cmCommand,local_288);
              }
              else {
                local_288[0]._M_dataplus._M_p = (pointer)&local_288[0].field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_288,"UPLOAD cannot set progress function: ","");
                curl_easy_strerror(CVar4);
                std::__cxx11::string::append((char *)local_288);
                cmCommand::SetError(&this->super_cmCommand,local_288);
              }
            }
            else {
              local_288[0]._M_dataplus._M_p = (pointer)&local_288[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_288,"UPLOAD cannot set noprogress value: ","");
              curl_easy_strerror(CVar4);
              std::__cxx11::string::append((char *)local_288);
              cmCommand::SetError(&this->super_cmCommand,local_288);
            }
LAB_003bb6e4:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288[0]._M_dataplus._M_p != &local_288[0].field_2) {
              operator_delete(local_288[0]._M_dataplus._M_p,
                              CONCAT71(local_288[0].field_2._M_allocated_capacity._1_7_,
                                       local_288[0].field_2._M_local_buf[0]) + 1);
            }
            bVar10 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)&((cURLProgressHelper *)local_c8)->Text + 0x10U)) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_288[0]._M_dataplus._M_p = (pointer)&local_288[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_288,"UPLOAD cannot set write data: ","");
          curl_easy_strerror(CVar4);
          std::__cxx11::string::append((char *)local_288);
          cmCommand::SetError(&this->super_cmCommand,local_288);
LAB_003bb364:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288[0]._M_dataplus._M_p != &local_288[0].field_2) {
            operator_delete(local_288[0]._M_dataplus._M_p,
                            CONCAT71(local_288[0].field_2._M_allocated_capacity._1_7_,
                                     local_288[0].field_2._M_local_buf[0]) + 1);
          }
          bVar10 = false;
        }
        if (local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      else {
        local_288[0]._M_dataplus._M_p = (pointer)&local_288[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_288,"UPLOAD cannot set fail on error flag: ","");
        curl_easy_strerror(CVar4);
        std::__cxx11::string::append((char *)local_288);
        cmCommand::SetError(&this->super_cmCommand,local_288);
LAB_003bb161:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288[0]._M_dataplus._M_p != &local_288[0].field_2) {
          operator_delete(local_288[0]._M_dataplus._M_p,
                          CONCAT71(local_288[0].field_2._M_allocated_capacity._1_7_,
                                   local_288[0].field_2._M_local_buf[0]) + 1);
        }
        bVar10 = false;
      }
      anon_unknown.dwarf_a08ab9::cURLEasyGuard::~cURLEasyGuard(&local_110);
      goto LAB_003bb191;
    }
    local_288[0]._M_dataplus._M_p = (pointer)&local_288[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_288,"UPLOAD error initializing curl.","");
    cmCommand::SetError(&this->super_cmCommand,local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288[0]._M_dataplus._M_p != &local_288[0].field_2) {
      operator_delete(local_288[0]._M_dataplus._M_p,
                      CONCAT71(local_288[0].field_2._M_allocated_capacity._1_7_,
                               local_288[0].field_2._M_local_buf[0]) + 1);
    }
    fclose(__stream);
  }
  bVar10 = false;
LAB_003bb191:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  if (local_2a8[0] != local_298) {
    operator_delete(local_2a8[0],local_298[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  return bVar10;
}

Assistant:

bool
cmFileCommand::HandleUploadCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  if(args.size() < 3)
    {
    this->SetError("UPLOAD must be called with at least three arguments.");
    return false;
    }
  std::vector<std::string>::const_iterator i = args.begin();
  ++i;
  std::string filename = *i;
  ++i;
  std::string url = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool showProgress = false;

  while(i != args.end())
    {
    if(*i == "TIMEOUT")
      {
      ++i;
      if(i != args.end())
        {
        timeout = atol(i->c_str());
        }
      else
        {
        this->SetError("UPLOAD missing time for TIMEOUT.");
        return false;
        }
      }
    else if(*i == "INACTIVITY_TIMEOUT")
      {
      ++i;
      if(i != args.end())
        {
        inactivity_timeout = atol(i->c_str());
        }
      else
        {
        this->SetError("UPLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
        }
      }
    else if(*i == "LOG")
      {
      ++i;
      if( i == args.end())
        {
        this->SetError("UPLOAD missing VAR for LOG.");
        return false;
        }
      logVar = *i;
      }
    else if(*i == "STATUS")
      {
      ++i;
      if( i == args.end())
        {
        this->SetError("UPLOAD missing VAR for STATUS.");
        return false;
        }
      statusVar = *i;
      }
    else if(*i == "SHOW_PROGRESS")
      {
      showProgress = true;
      }

    ++i;
    }

  // Open file for reading:
  //
  FILE *fin = cmsys::SystemTools::Fopen(filename, "rb");
  if(!fin)
    {
    std::string errStr = "UPLOAD cannot open file '";
    errStr += filename + "' for reading.";
    this->SetError(errStr);
    return false;
    }

  unsigned long file_size = cmsys::SystemTools::FileLength(filename);

#if defined(_WIN32) && defined(CMAKE_ENCODING_UTF8)
  url = fix_file_url_windows(url);
#endif

  ::CURL *curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if(!curl)
    {
    this->SetError("UPLOAD error initializing curl.");
    fclose(fin);
    return false;
    }

  cURLEasyGuard g_curl(curl);

  // enable HTTP ERROR parsing
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "UPLOAD cannot set fail on error flag: ");

  // enable uploading
  res = ::curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);
  check_curl_result(res, "UPLOAD cannot set upload flag: ");

  res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "UPLOAD cannot set url: ");

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION,
                           cmWriteToMemoryCallback);
  check_curl_result(res, "UPLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "UPLOAD cannot set debug function: ");

  cmFileCommandVectorOfChar chunkResponse;
  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, (void *)&chunkResponse);
  check_curl_result(res, "UPLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, (void *)&chunkDebug);
  check_curl_result(res, "UPLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "UPLOAD cannot set follow-redirect option: ");

  if(!logVar.empty())
    {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "UPLOAD cannot set verbose: ");
    }

  if(timeout > 0)
    {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout );
    check_curl_result(res, "UPLOAD cannot set timeout: ");
    }

  if(inactivity_timeout > 0)
    {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
    }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(this, "upload");

  if(showProgress)
    {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "UPLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl,
      CURLOPT_PROGRESSFUNCTION, cmFileUploadProgressCallback);
    check_curl_result(res, "UPLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl,
      CURLOPT_PROGRESSDATA, reinterpret_cast<void*>(&helper));
    check_curl_result(res, "UPLOAD cannot set progress data: ");
    }

  // now specify which file to upload
  res = ::curl_easy_setopt(curl, CURLOPT_INFILE, fin);
  check_curl_result(res, "UPLOAD cannot set input file: ");

  // and give the size of the upload (optional)
  res = ::curl_easy_setopt(curl,
    CURLOPT_INFILESIZE, static_cast<long>(file_size));
  check_curl_result(res, "UPLOAD cannot set input file size: ");

  res = ::curl_easy_perform(curl);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if(!statusVar.empty())
    {
    std::ostringstream result;
    result << (int)res << ";\"" << ::curl_easy_strerror(res) << "\"";
    this->Makefile->AddDefinition(statusVar,
                                  result.str().c_str());
    }

  ::curl_global_cleanup();

  fclose(fin);
  fin = NULL;

  if(!logVar.empty())
    {
    std::string log;

    if(!chunkResponse.empty())
      {
      chunkResponse.push_back(0);
      log += "Response:\n";
      log += &*chunkResponse.begin();
      log += "\n";
      }

    if(!chunkDebug.empty())
      {
      chunkDebug.push_back(0);
      log += "Debug:\n";
      log += &*chunkDebug.begin();
      log += "\n";
      }

    this->Makefile->AddDefinition(logVar, log.c_str());
    }

  return true;
#else
  this->SetError("UPLOAD not supported by bootstrap cmake.");
  return false;
#endif
}